

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::AddImageRounded
          (ImDrawList *this,ImTextureID user_texture_id,ImVec2 *p_min,ImVec2 *p_max,ImVec2 *uv_min,
          ImVec2 *uv_max,ImU32 col,float rounding,ImDrawFlags flags)

{
  ImDrawList *in_RCX;
  ImVec2 in_RSI;
  ImVec2 *in_RDI;
  ImTextureID in_R8;
  ImVec2 *in_R9;
  float in_XMM0_Da;
  uint in_stack_00000008;
  uint in_stack_00000010;
  int vert_end_idx;
  int vert_start_idx;
  bool push_texture_id;
  bool in_stack_0000006f;
  ImVec2 *in_stack_00000070;
  ImVec2 *in_stack_00000078;
  ImVec2 *in_stack_00000080;
  int in_stack_00000088;
  int in_stack_0000008c;
  ImDrawList *in_stack_00000090;
  ImVec2 *in_stack_000000a0;
  ImTextureID in_stack_ffffffffffffffa8;
  ImU32 col_00;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar1;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  uint uVar2;
  
  if ((in_stack_00000008 & 0xff000000) != 0) {
    in_stack_00000010 = FixRectCornerFlags(in_stack_00000010);
    if ((in_XMM0_Da <= 0.0) || ((in_stack_00000010 & 0x1f0) == 0x100)) {
      AddImage(in_RCX,in_R8,in_R9,(ImVec2 *)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffc8),
               (ImVec2 *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),in_RDI,
               (ImU32)in_RSI.x);
    }
    else {
      uVar2 = (uint)(in_RSI != in_RDI[0x13]) << 0x18;
      if (in_RSI != in_RDI[0x13]) {
        PushTextureID((ImDrawList *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                      in_stack_ffffffffffffffa8);
      }
      col_00 = (ImU32)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
      PathRect((ImDrawList *)p_min,p_max,uv_min,uv_max._4_4_,(ImDrawFlags)uv_max);
      PathFillConvex((ImDrawList *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     col_00);
      uVar1 = 1;
      ImGui::ShadeVertsLinearUV
                (in_stack_00000090,in_stack_0000008c,in_stack_00000088,in_stack_00000080,
                 in_stack_00000078,in_stack_00000070,in_stack_000000a0,in_stack_0000006f);
      if ((uVar2 & 0x1000000) != 0) {
        PopTextureID((ImDrawList *)CONCAT44(in_stack_ffffffffffffffb4,uVar1));
      }
    }
  }
  return;
}

Assistant:

void ImDrawList::AddImageRounded(ImTextureID user_texture_id, const ImVec2& p_min, const ImVec2& p_max, const ImVec2& uv_min, const ImVec2& uv_max, ImU32 col, float rounding, ImDrawFlags flags)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;

    flags = FixRectCornerFlags(flags);
    if (rounding <= 0.0f || (flags & ImDrawFlags_RoundCornersMask_) == ImDrawFlags_RoundCornersNone)
    {
        AddImage(user_texture_id, p_min, p_max, uv_min, uv_max, col);
        return;
    }

    const bool push_texture_id = user_texture_id != _CmdHeader.TextureId;
    if (push_texture_id)
        PushTextureID(user_texture_id);

    int vert_start_idx = VtxBuffer.Size;
    PathRect(p_min, p_max, rounding, flags);
    PathFillConvex(col);
    int vert_end_idx = VtxBuffer.Size;
    ImGui::ShadeVertsLinearUV(this, vert_start_idx, vert_end_idx, p_min, p_max, uv_min, uv_max, true);

    if (push_texture_id)
        PopTextureID();
}